

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::ShaderSubroutine::FunctionalTest11::iterate(FunctionalTest11 *this)

{
  ostringstream *this_00;
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  int iVar4;
  MessageBuilder *this_01;
  NotSupportedError *this_02;
  socklen_t sVar5;
  sockaddr *__addr;
  sockaddr *__addr_00;
  char *description;
  FunctionalTest11 *this_03;
  long lVar6;
  testConfiguration *value;
  bool bVar7;
  framebuffer framebuffer;
  texture color_texture;
  texture red_texture;
  texture blue_texture;
  vertexArray vao;
  program program;
  undefined1 local_1b0 [384];
  
  if (iterate()::test_configurations == '\0') {
    iVar4 = __cxa_guard_acquire(&iterate()::test_configurations);
    if (iVar4 != 0) {
      iterate::test_configurations[0].m_description = "Expect red color from 1st sampler";
      iterate::test_configurations[0].m_expected_color[0] = 0xff;
      iterate::test_configurations[0].m_expected_color[1] = '\0';
      iterate::test_configurations[0].m_expected_color[2] = '\0';
      iterate::test_configurations[0].m_expected_color[3] = 0xff;
      iterate::test_configurations[0].m_routines[0] = 1;
      iterate::test_configurations[0].m_routines[1] = 0;
      iterate::test_configurations[0].m_routines[2] = 0;
      iterate::test_configurations[0].m_routines[3] = 0;
      iterate::test_configurations[0].m_routines[4] = 0;
      iterate::test_configurations[0].m_samplers[0] = 1;
      iterate::test_configurations[0].m_samplers[1] = 0;
      iterate::test_configurations[1].m_description =
           "Test \"without discard\" option, expect no blue color from 2nd sampler";
      iterate::test_configurations[1].m_expected_color[0] = '\0';
      iterate::test_configurations[1].m_expected_color[1] = '\0';
      iterate::test_configurations[1].m_expected_color[2] = 0xff;
      iterate::test_configurations[1].m_expected_color[3] = 0xff;
      iterate::test_configurations[1].m_routines[0] = 0;
      iterate::test_configurations[1].m_routines[1] = 1;
      iterate::test_configurations[1].m_routines[2] = 1;
      iterate::test_configurations[1].m_routines[3] = 1;
      iterate::test_configurations[1].m_routines[4] = 1;
      iterate::test_configurations[1].m_samplers[0] = 0;
      iterate::test_configurations[1].m_samplers[1] = 1;
      iterate::test_configurations[2].m_description = "Fragment shoud be discarded";
      iterate::test_configurations[2].m_expected_color[0] = '\0';
      iterate::test_configurations[2].m_expected_color[1] = '\0';
      iterate::test_configurations[2].m_expected_color[2] = '\0';
      iterate::test_configurations[2].m_expected_color[3] = '\0';
      iterate::test_configurations[2].m_routines[0] = 0;
      iterate::test_configurations[2].m_routines[1] = 0;
      iterate::test_configurations[2].m_routines[2] = 0;
      iterate::test_configurations[2].m_routines[3] = 0;
      iterate::test_configurations[2].m_routines[4] = 0;
      iterate::test_configurations[2].m_samplers[0] = 1;
      iterate::test_configurations[2].m_samplers[1] = 0;
      iterate::test_configurations[3].m_description = "Expect blue color from 1st sampler";
      iterate::test_configurations[3].m_expected_color[0] = '\0';
      iterate::test_configurations[3].m_expected_color[1] = '\0';
      iterate::test_configurations[3].m_expected_color[2] = 0xff;
      iterate::test_configurations[3].m_expected_color[3] = 0xff;
      iterate::test_configurations[3].m_routines._0_8_ = &DAT_100000001;
      iterate::test_configurations[3].m_routines[2] = 0;
      iterate::test_configurations[3].m_routines[3] = 0;
      iterate::test_configurations[3].m_routines[4] = 0;
      iterate::test_configurations[3].m_samplers[0] = 0;
      iterate::test_configurations[4].m_description = "Expect red color from 2nd sampler";
      iterate::test_configurations[4].m_expected_color[0] = 0xff;
      iterate::test_configurations[4].m_expected_color[1] = '\0';
      iterate::test_configurations[4].m_expected_color[2] = '\0';
      iterate::test_configurations[4].m_expected_color[3] = 0xff;
      iterate::test_configurations[4].m_routines[0] = 1;
      iterate::test_configurations[4].m_routines[1] = 0;
      iterate::test_configurations[4].m_routines[2] = 1;
      iterate::test_configurations[4].m_routines[3] = 0;
      iterate::test_configurations[4].m_routines[4] = 0;
      iterate::test_configurations[4].m_samplers[0] = 0;
      iterate::test_configurations[5].m_description = "Expect no blue color from 2nd sampler";
      iterate::test_configurations[5].m_expected_color[0] = '\0';
      iterate::test_configurations[5].m_expected_color[1] = '\0';
      iterate::test_configurations[5].m_expected_color[2] = 0xff;
      iterate::test_configurations[5].m_expected_color[3] = 0xff;
      iterate::test_configurations[5].m_routines[0] = 1;
      iterate::test_configurations[5].m_routines[1] = 1;
      iterate::test_configurations[5].m_routines[2] = 1;
      iterate::test_configurations[5].m_routines[3] = 1;
      iterate::test_configurations[5].m_routines[4] = 0;
      iterate::test_configurations[5].m_samplers[0] = 0;
      iterate::test_configurations[3].m_samplers[1] = iterate::test_configurations[1].m_samplers[1];
      iterate::test_configurations[4].m_samplers[1] = iterate::test_configurations[1].m_samplers[1];
      iterate::test_configurations[5].m_samplers[1] = iterate::test_configurations[1].m_samplers[1];
      __cxa_guard_release(&iterate()::test_configurations);
    }
  }
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (bVar1) {
    framebuffer.m_context = (this->super_TestCase).m_context;
    blue_texture.m_id = 0;
    color_texture.m_id = 0;
    framebuffer.m_id = 0;
    program.m_tesselation_control_shader_id = 0;
    program.m_tesselation_evaluation_shader_id = 0;
    program.m_vertex_shader_id = 0;
    program.m_compute_shader_id = 0;
    program.m_fragment_shader_id = 0;
    program.m_geometry_shader_id = 0;
    program.m_program_object_id = 0;
    red_texture.m_id = 0;
    vao.m_id = 0;
    sVar5 = 0x16b46b9;
    iVar4 = 0;
    color_texture.m_context = framebuffer.m_context;
    red_texture.m_context = framebuffer.m_context;
    blue_texture.m_context = framebuffer.m_context;
    vao.m_context = framebuffer.m_context;
    program.m_context = framebuffer.m_context;
    Utils::program::build
              (&program,(GLchar *)0x0,
               "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\n// Output\nlayout(location = 0) out vec4 out_color;\n\n// Global variables\nvec4 success_color;\nvec4 failure_color;\n\n// Samplers\nuniform sampler2D sampler_1;\nuniform sampler2D sampler_2;\n\n// Functions\nbool are_same(in vec4 left, in vec4 right)\n{\n    bvec4 result;\n\n    result.x = (left.x == right.x);\n    result.y = (left.y == right.y);\n    result.z = (left.z == right.z);\n    result.w = (left.w == right.w);\n\n    return all(result);\n}\n\nbool are_different(in vec4 left, in vec4 right)\n{\n    bvec4 result;\n\n    result.x = (left.x != right.x);\n    result.y = (left.y != right.y);\n    result.z = (left.z != right.z);\n    result.w = (left.w != right.w);\n\n    return any(result);\n}\n\n// Subroutine types\nsubroutine void discard_fragment_type(void);\nsubroutine void set_global_colors_type(void);\nsubroutine vec4 sample_texture_type(in vec2);\nsubroutine bool comparison_type(in vec4 left, in vec4 right);\nsubroutine void test_type(void);\n\n// Subroutine definitions\n// discard_fragment_type\nsubroutine(discard_fragment_type) void discard_yes(void)\n{\n    discard;\n}\n\nsubroutine(discard_fragment_type) void discard_no(void)\n{\n}\n\n// set_global_colors_type\nsubroutine(set_global_colors_type) void red_pass_blue_fail(void)\n{\n    success_color = vec4(1, 0, 0, 1);\n    failure_color = vec4(0, 0, 1, 1);\n}\n\nsubroutine(set_global_colors_type) void blue_pass_red_fail(void)\n{\n    success_color = vec4(0, 0, 1, 1);\n    failure_color = vec4(1, 0, 0, 1);\n}\n\n// sample_texture_type\nsubroutine(sample_texture_type) vec4 first_sampler(in vec2 coord)\n{\n    return texture(sampler_1, coord);\n}\n\nsubroutine(sample_texture_type) vec4 second_sampler(in vec2 coord)\n{\n    return texture(sampler_2, coord);\n}\n\n// comparison_type\nsubroutine(comparison_type) bool check_equal(in vec4 left, in vec4 right)\n{\n    return are_same(left, right);\n}\n\nsubroutine(comparison_type) bool check_not_equal(in vec4 left, in vec4 right)\n{\n    return are_different(left, right);\n}\n\n// Subroutine uniforms\nsubrouti..." /* TRUNCATED STRING LITERAL */
               ,
               "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nvoid main()\n{\n    gl_Position = vec4(-1, -1, 0, 1);\n    EmitVertex();\n    \n    gl_Position = vec4(-1,  1, 0, 1);\n    EmitVertex();\n    \n    gl_Position = vec4( 1, -1, 0, 1);\n    EmitVertex();\n    \n    gl_Position = vec4( 1,  1, 0, 1);\n    EmitVertex();\n    \n    EndPrimitive();\n}\n\n"
               ,(GLchar *)0x0,(GLchar *)0x0,
               "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nvoid main()\n{\n}\n\n"
               ,(GLchar **)0x0,0,false);
    Utils::program::use(&program);
    Utils::vertexArray::generate(&vao);
    Utils::vertexArray::bind(&vao,iVar4,__addr,sVar5);
    Utils::texture::create(&blue_texture,0x20,0x20,0x8058);
    Utils::texture::create(&color_texture,0x20,0x20,0x8058);
    iVar4 = 0x20;
    sVar5 = 0x8058;
    Utils::texture::create(&red_texture,0x20,0x20,0x8058);
    Utils::framebuffer::generate(&framebuffer);
    Utils::framebuffer::bind(&framebuffer,iVar4,__addr_00,sVar5);
    this_03 = (FunctionalTest11 *)&framebuffer;
    Utils::framebuffer::attachTexture((framebuffer *)this_03,0x8ce0,color_texture.m_id,0x20,0x20);
    for (lVar6 = 0; lVar6 != 0x28; lVar6 = lVar6 + 8) {
      GVar2 = Utils::program::getSubroutineIndex
                        (&program,*(GLchar **)((long)iterate::subroutine_names[0] + lVar6 * 2),
                         0x8b30);
      *(GLuint *)((long)this->m_subroutine_indices[0] + lVar6) = GVar2;
      this_03 = (FunctionalTest11 *)&program;
      GVar2 = Utils::program::getSubroutineIndex
                        (&program,*(GLchar **)((long)iterate::subroutine_names[0] + lVar6 * 2 + 8),
                         0x8b30);
      *(GLuint *)((long)this->m_subroutine_indices[0] + lVar6 + 4) = GVar2;
    }
    for (lVar6 = 0; lVar6 != 0x14; lVar6 = lVar6 + 4) {
      this_03 = (FunctionalTest11 *)&program;
      GVar3 = Utils::program::getSubroutineUniformLocation
                        (&program,(GLchar *)
                                  ((long)&
                                         _ZZN6gl4cts16ShaderSubroutine16FunctionalTest117iterateEvE24subroutine_uniform_names_rel
                                  + (long)*(int *)((long)&
                                                  _ZZN6gl4cts16ShaderSubroutine16FunctionalTest117iterateEvE24subroutine_uniform_names_rel
                                                  + lVar6)),0x8b30);
      *(GLint *)((long)this->m_subroutine_uniform_locations + lVar6) = GVar3;
    }
    for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 4) {
      this_03 = (FunctionalTest11 *)&program;
      GVar3 = Utils::program::getUniformLocation
                        (&program,(GLchar *)
                                  ((long)&
                                         _ZZN6gl4cts16ShaderSubroutine16FunctionalTest117iterateEvE13uniform_names_rel
                                  + (long)*(int *)((long)&
                                                  _ZZN6gl4cts16ShaderSubroutine16FunctionalTest117iterateEvE13uniform_names_rel
                                                  + lVar6)));
      *(GLint *)((long)this->m_uniform_locations + lVar6) = GVar3;
    }
    fillTexture(this_03,&blue_texture,"");
    fillTexture(this_03,&color_texture,"");
    fillTexture(this_03,&red_texture,iterate::red_color);
    this->m_source_textures[0] = blue_texture.m_id;
    this->m_source_textures[1] = red_texture.m_id;
    Utils::framebuffer::clearColor(&framebuffer,0.0,0.0,0.0,0.0);
    bVar1 = true;
    lVar6 = 6;
    value = iterate::test_configurations;
    this_00 = (ostringstream *)(local_1b0 + 8);
    while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
      Utils::framebuffer::clear(&framebuffer,0x4000);
      bVar7 = testDraw(this,value->m_routines,value->m_samplers,value->m_expected_color,
                       &color_texture);
      if (!bVar7) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"Error. Failure for configuration: ");
        this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&value->m_description)
        ;
        tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        bVar1 = false;
      }
      value = value + 1;
    }
    description = "Fail";
    if (bVar1) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (byte)~bVar1 & QP_TEST_RESULT_FAIL,description);
    Utils::vertexArray::~vertexArray(&vao);
    Utils::texture::~texture(&red_texture);
    Utils::program::~program(&program);
    Utils::framebuffer::~framebuffer(&framebuffer);
    Utils::texture::~texture(&color_texture);
    Utils::texture::~texture(&blue_texture);
    return STOP;
  }
  this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,"GL_ARB_shader_subroutine is not supported.",
             (allocator<char> *)&program);
  tcu::NotSupportedError::NotSupportedError(this_02,(string *)local_1b0);
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest11::iterate()
{
	static const GLchar* fragment_shader_code =
		"#version 400 core\n"
		"#extension GL_ARB_shader_subroutine : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"// Output\n"
		"layout(location = 0) out vec4 out_color;\n"
		"\n"
		"// Global variables\n"
		"vec4 success_color;\n"
		"vec4 failure_color;\n"
		"\n"
		"// Samplers\n"
		"uniform sampler2D sampler_1;\n"
		"uniform sampler2D sampler_2;\n"
		"\n"
		"// Functions\n"
		"bool are_same(in vec4 left, in vec4 right)\n"
		"{\n"
		"    bvec4 result;\n"
		"\n"
		"    result.x = (left.x == right.x);\n"
		"    result.y = (left.y == right.y);\n"
		"    result.z = (left.z == right.z);\n"
		"    result.w = (left.w == right.w);\n"
		"\n"
		"    return all(result);\n"
		"}\n"
		"\n"
		"bool are_different(in vec4 left, in vec4 right)\n"
		"{\n"
		"    bvec4 result;\n"
		"\n"
		"    result.x = (left.x != right.x);\n"
		"    result.y = (left.y != right.y);\n"
		"    result.z = (left.z != right.z);\n"
		"    result.w = (left.w != right.w);\n"
		"\n"
		"    return any(result);\n"
		"}\n"
		"\n"
		"// Subroutine types\n"
		"subroutine void discard_fragment_type(void);\n"
		"subroutine void set_global_colors_type(void);\n"
		"subroutine vec4 sample_texture_type(in vec2);\n"
		"subroutine bool comparison_type(in vec4 left, in vec4 right);\n"
		"subroutine void test_type(void);\n"
		"\n"
		"// Subroutine definitions\n"
		"// discard_fragment_type\n"
		"subroutine(discard_fragment_type) void discard_yes(void)\n"
		"{\n"
		"    discard;\n"
		"}\n"
		"\n"
		"subroutine(discard_fragment_type) void discard_no(void)\n"
		"{\n"
		"}\n"
		"\n"
		"// set_global_colors_type\n"
		"subroutine(set_global_colors_type) void red_pass_blue_fail(void)\n"
		"{\n"
		"    success_color = vec4(1, 0, 0, 1);\n"
		"    failure_color = vec4(0, 0, 1, 1);\n"
		"}\n"
		"\n"
		"subroutine(set_global_colors_type) void blue_pass_red_fail(void)\n"
		"{\n"
		"    success_color = vec4(0, 0, 1, 1);\n"
		"    failure_color = vec4(1, 0, 0, 1);\n"
		"}\n"
		"\n"
		"// sample_texture_type\n"
		"subroutine(sample_texture_type) vec4 first_sampler(in vec2 coord)\n"
		"{\n"
		"    return texture(sampler_1, coord);\n"
		"}\n"
		"\n"
		"subroutine(sample_texture_type) vec4 second_sampler(in vec2 coord)\n"
		"{\n"
		"    return texture(sampler_2, coord);\n"
		"}\n"
		"\n"
		"// comparison_type\n"
		"subroutine(comparison_type) bool check_equal(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return are_same(left, right);\n"
		"}\n"
		"\n"
		"subroutine(comparison_type) bool check_not_equal(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return are_different(left, right);\n"
		"}\n"
		"\n"
		"// Subroutine uniforms\n"
		"subroutine uniform discard_fragment_type  discard_fragment;\n"
		"subroutine uniform set_global_colors_type set_global_colors;\n"
		"subroutine uniform sample_texture_type    sample_texture;\n"
		"subroutine uniform comparison_type        compare;\n"
		"\n"
		"// Subroutine definitions\n"
		"// test_type\n"
		"subroutine(test_type) void test_with_discard(void)\n"
		"{\n"
		"    discard_fragment();"
		"\n"
		"    out_color = failure_color;\n"
		"\n"
		"    set_global_colors();\n"
		"\n"
		"    vec4 sampled_color = sample_texture(gl_PointCoord);\n"
		"\n"
		"    bool comparison_result = compare(success_color, sampled_color);\n"
		"\n"
		"    if (true == comparison_result)\n"
		"    {\n"
		"        out_color = success_color;\n"
		"    }\n"
		"    else\n"
		"    {\n"
		"        out_color = failure_color;\n"
		"    }\n"
		"}\n"
		"\n"
		"subroutine(test_type) void test_without_discard(void)\n"
		"{\n"
		"    set_global_colors();\n"
		"\n"
		"    vec4 sampled_color = sample_texture(gl_PointCoord);\n"
		"\n"
		"    bool comparison_result = compare(success_color, sampled_color);\n"
		"\n"
		"    if (true == comparison_result)\n"
		"    {\n"
		"        out_color = success_color;\n"
		"    }\n"
		"    else\n"
		"    {\n"
		"        out_color = failure_color;\n"
		"    }\n"
		"}\n"
		"\n"
		"// Subroutine uniforms\n"
		"subroutine uniform test_type test;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    // Set colors\n"
		"    success_color = vec4(0.5, 0.5, 0.5, 0.5);\n"
		"    failure_color = vec4(0.5, 0.5, 0.5, 0.5);\n"
		"\n"
		"    test();\n"
		"}\n"
		"\n";

	static const GLchar* geometry_shader_code = "#version 400 core\n"
												"#extension GL_ARB_shader_subroutine : require\n"
												"\n"
												"precision highp float;\n"
												"\n"
												"layout(points)                           in;\n"
												"layout(triangle_strip, max_vertices = 4) out;\n"
												"\n"
												"void main()\n"
												"{\n"
												"    gl_Position = vec4(-1, -1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4(-1,  1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4( 1, -1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4( 1,  1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    EndPrimitive();\n"
												"}\n"
												"\n";

	static const GLchar* vertex_shader_code = "#version 400 core\n"
											  "#extension GL_ARB_shader_subroutine : require\n"
											  "\n"
											  "precision highp float;\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "}\n"
											  "\n";

	static const GLchar* subroutine_names[][2] = { { "discard_yes", "discard_no" },
												   { "red_pass_blue_fail", "blue_pass_red_fail" },
												   { "first_sampler", "second_sampler" },
												   { "check_equal", "check_not_equal" },
												   { "test_with_discard", "test_without_discard" } };
	static const GLuint n_subroutine_types = sizeof(subroutine_names) / sizeof(subroutine_names[0]);

	static const GLchar* subroutine_uniform_names[] = { "discard_fragment", "set_global_colors", "sample_texture",
														"compare", "test" };
	static const GLuint n_subroutine_uniform_names =
		sizeof(subroutine_uniform_names) / sizeof(subroutine_uniform_names[0]);

	static const GLchar* uniform_names[] = {
		"sampler_1", "sampler_2",
	};
	static const GLuint n_uniform_names = sizeof(uniform_names) / sizeof(uniform_names[0]);

	/* Colors */
	static const GLubyte blue_color[4]  = { 0, 0, 255, 255 };
	static const GLubyte clean_color[4] = { 0, 0, 0, 0 };
	static const GLubyte red_color[4]   = { 255, 0, 0, 255 };

	/* Configurations */
	static const testConfiguration test_configurations[] = {
		testConfiguration(
			"Expect red color from 1st sampler", red_color, 1 /* discard_fragment  : discard_no         */,
			0 /* set_global_colors : red_pass_blue_fail */, 0 /* sample_texture    : first_sampler      */,
			0 /* compare           : check_equal        */, 0 /* test              : test_with_discard  */, 1 /* red */,
			0 /* blue */),

		testConfiguration(
			"Test \"without discard\" option, expect no blue color from 2nd sampler", blue_color,
			0 /* discard_fragment  : discard_yes           */, 1 /* set_global_colors : blue_pass_red_fail    */,
			1 /* sample_texture    : second_sampler        */, 1 /* compare           : check_not_equal       */,
			1 /* test              : test_without_discard  */, 0 /* blue */, 1 /* red */),

		testConfiguration("Fragment shoud be discarded", clean_color, 0 /* discard_fragment  : discard_yes        */,
						  0 /* set_global_colors : red_pass_blue_fail */,
						  0 /* sample_texture    : first_sampler      */,
						  0 /* compare           : check_equal        */,
						  0 /* test              : test_with_discard  */, 1 /* red */, 0 /* blue */),

		testConfiguration(
			"Expect blue color from 1st sampler", blue_color, 1 /* discard_fragment  : discard_no         */,
			1 /* set_global_colors : blue_pass_red_fail */, 0 /* sample_texture    : first_sampler      */,
			0 /* compare           : check_equal        */, 0 /* test              : test_with_discard  */,
			0 /* blue */, 1 /* red */),

		testConfiguration(
			"Expect red color from 2nd sampler", red_color, 1 /* discard_fragment  : discard_no         */,
			0 /* set_global_colors : red_pass_blue_fail */, 1 /* sample_texture    : second_sampler     */,
			0 /* compare           : check_equal        */, 0 /* test              : test_with_discard  */,
			0 /* blue */, 1 /* red */),

		testConfiguration(
			"Expect no blue color from 2nd sampler", blue_color, 1 /* discard_fragment  : discard_no         */,
			1 /* set_global_colors : blue_pass_red_fail */, 1 /* sample_texture    : second_sampler     */,
			1 /* compare           : check_not_equal    */, 0 /* test              : test_with_discard  */,
			0 /* blue */, 1 /* red */),
	};
	static const GLuint n_test_cases = sizeof(test_configurations) / sizeof(test_configurations[0]);

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* GL objects */
	Utils::texture	 blue_texture(m_context);
	Utils::texture	 color_texture(m_context);
	Utils::framebuffer framebuffer(m_context);
	Utils::program	 program(m_context);
	Utils::texture	 red_texture(m_context);
	Utils::vertexArray vao(m_context);

	/* Init GL objects */
	program.build(0 /* cs */, fragment_shader_code /* fs */, geometry_shader_code /* gs */, 0 /* tcs */, 0 /* test */,
				  vertex_shader_code, 0 /* varying_names */, 0 /* n_varyings */);

	program.use();

	vao.generate();
	vao.bind();

	blue_texture.create(m_texture_width, m_texture_height, GL_RGBA8);
	color_texture.create(m_texture_width, m_texture_height, GL_RGBA8);
	red_texture.create(m_texture_width, m_texture_height, GL_RGBA8);

	framebuffer.generate();
	framebuffer.bind();
	framebuffer.attachTexture(GL_COLOR_ATTACHMENT0, color_texture.m_id, m_texture_width, m_texture_height);

	/* Get subroutine indices */
	for (GLuint type = 0; type < n_subroutine_types; ++type)
	{
		m_subroutine_indices[type][0] = program.getSubroutineIndex(subroutine_names[type][0], GL_FRAGMENT_SHADER);
		m_subroutine_indices[type][1] = program.getSubroutineIndex(subroutine_names[type][1], GL_FRAGMENT_SHADER);
	}

	/* Get subroutine uniform locations */
	for (GLuint uniform = 0; uniform < n_subroutine_uniform_names; ++uniform)
	{
		m_subroutine_uniform_locations[uniform] =
			program.getSubroutineUniformLocation(subroutine_uniform_names[uniform], GL_FRAGMENT_SHADER);
	}

	/* Get uniform locations */
	for (GLuint i = 0; i < n_uniform_names; ++i)
	{
		m_uniform_locations[i] = program.getUniformLocation(uniform_names[i]);
	}

	/* Prepare textures */
	fillTexture(blue_texture, blue_color);
	fillTexture(color_texture, clean_color);
	fillTexture(red_texture, red_color);

	m_source_textures[0] = blue_texture.m_id;
	m_source_textures[1] = red_texture.m_id;

	framebuffer.clearColor(0.0f, 0.0f, 0.0f, 0.0f);

	/* Test */
	bool result = true;
	for (GLuint i = 0; i < n_test_cases; ++i)
	{
		/* Clean output texture */
		framebuffer.clear(GL_COLOR_BUFFER_BIT);

		/* Execute test */
		if (false == testDraw(test_configurations[i].m_routines, test_configurations[i].m_samplers,
							  test_configurations[i].m_expected_color, color_texture))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Error. Failure for configuration: " << test_configurations[i].m_description
				<< tcu::TestLog::EndMessage;

			result = false;
		}
	}

	/* Set result */
	if (true == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}